

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O2

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort16Parallel
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  uchar uVar1;
  uint16_t *puVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  uchar **ppuVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  uint16_t uVar12;
  undefined7 in_register_00000081;
  size_t i_1;
  size_t cnt [65536];
  
  memset(cnt,0,0x80000);
  ppuVar7 = this->temp_;
  ppuVar4 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar7 = this->data_;
    ppuVar4 = this->temp_;
  }
  puVar2 = this->letters16_;
  for (sVar8 = bgn; sVar10 = bgn, end != sVar8; sVar8 = sVar8 + 1) {
    uVar1 = ppuVar4[sVar8][depth];
    if (uVar1 == '\0') {
      uVar12 = 0;
    }
    else {
      uVar12 = CONCAT11(uVar1,ppuVar4[sVar8][depth + 1]);
    }
    puVar2[sVar8] = uVar12;
  }
  for (; end != sVar10; sVar10 = sVar10 + 1) {
    cnt[puVar2[sVar10]] = cnt[puVar2[sVar10]] + 1;
  }
  sVar8 = 0;
  for (lVar9 = 0; sVar10 = bgn, lVar9 != 0x10000; lVar9 = lVar9 + 1) {
    sVar10 = cnt[lVar9];
    cnt[lVar9] = sVar8;
    sVar8 = sVar10 + sVar8;
  }
  for (; end != sVar10; sVar10 = sVar10 + 1) {
    sVar8 = cnt[puVar2[sVar10]];
    cnt[puVar2[sVar10]] = sVar8 + 1;
    puVar3 = ppuVar7[bgn + sVar8];
    ppuVar7[bgn + sVar8] = ppuVar4[sVar10];
    ppuVar4[sVar10] = puVar3;
  }
  if (!flip) {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      uVar11 = uVar5;
      if (uVar5 != 0) {
        if (uVar5 == 0x100) break;
        uVar11 = uVar5 << 8;
        uVar6 = cnt[uVar5 * 0x100 + -1];
      }
      uVar11 = cnt[uVar11];
      for (; uVar6 < uVar11; uVar6 = uVar6 + 1) {
        ppuVar4[bgn + uVar6] = ppuVar7[bgn + uVar6];
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  for (lVar9 = 1; lVar9 != 0x10000; lVar9 = lVar9 + 1) {
    if ((char)lVar9 != '\0') {
      if (cnt[lVar9] != cnt[lVar9 + -1]) {
        Recurse(this,cnt[lVar9 + -1] + bgn,cnt[lVar9] + bgn,depth + 2,!flip);
      }
    }
  }
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort16Parallel(size_t bgn, size_t end, size_t depth, bool flip) {
  size_t cnt[1 << 16] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint16_t *let = letters16_ + bgn;
  size_t n = end - bgn;

  #ifdef _OPENMP
  #pragma omp parallel for schedule(static)
  #endif
  for (size_t i = 0; i < n; ++i) {
    uint16_t x = src[i][depth];
    let[i] = x == 0 ? 0 : ((x << 8) | src[i][depth + 1]);
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  {
    size_t s = 0;
    for (int i = 0; i < 1 << 16; ++i) {
      std::swap(cnt[i], s);
      s += cnt[i];
    }
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    #ifdef _OPENMP
    #pragma omp parallel for schedule(static)
    #endif
    for (int i = 0; i < 1 << 8; ++i) {
      size_t b = i == 0 ? 0 : cnt[(i << 8) - 1];
      size_t e = cnt[i << 8];
      for (size_t j = b; j < e; ++j) {
        src[j] = dst[j];
      }
    }
  }

  #ifdef _OPENMP
  #pragma omp parallel for schedule(dynamic)
  #endif
  for (size_t i = 1; i < 1 << 16; ++i) {
    if ((i & 0xFF) != 0 && cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 2, !flip);
    }
  }
}